

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O2

size_t __thiscall RVO::RVOSimulator::addAgent(RVOSimulator *this,Vector2 *position)

{
  Agent *pAVar1;
  float fVar2;
  Agent *this_00;
  size_t sVar3;
  Agent *agent;
  
  if (this->defaultAgent_ == (Agent *)0x0) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    this_00 = (Agent *)operator_new(0x98);
    Agent::Agent(this_00,this);
    this_00->position_ = *position;
    pAVar1 = this->defaultAgent_;
    this_00->maxNeighbors_ = pAVar1->maxNeighbors_;
    fVar2 = pAVar1->neighborDist_;
    this_00->maxSpeed_ = pAVar1->maxSpeed_;
    this_00->neighborDist_ = fVar2;
    this_00->radius_ = pAVar1->radius_;
    fVar2 = pAVar1->timeHorizonObst_;
    this_00->timeHorizon_ = pAVar1->timeHorizon_;
    this_00->timeHorizonObst_ = fVar2;
    this_00->velocity_ = pAVar1->velocity_;
    this_00->id_ = (long)(this->agents_).
                         super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->agents_).
                         super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
    agent = this_00;
    std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::push_back(&this->agents_,&agent);
    sVar3 = ((long)(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
  }
  return sVar3;
}

Assistant:

size_t RVOSimulator::addAgent(const Vector2 &position)
	{
		if (defaultAgent_ == NULL) {
			return RVO_ERROR;
		}

		Agent *agent = new Agent(this);

		agent->position_ = position;
		agent->maxNeighbors_ = defaultAgent_->maxNeighbors_;
		agent->maxSpeed_ = defaultAgent_->maxSpeed_;
		agent->neighborDist_ = defaultAgent_->neighborDist_;
		agent->radius_ = defaultAgent_->radius_;
		agent->timeHorizon_ = defaultAgent_->timeHorizon_;
		agent->timeHorizonObst_ = defaultAgent_->timeHorizonObst_;
		agent->velocity_ = defaultAgent_->velocity_;

		agent->id_ = agents_.size();

		agents_.push_back(agent);

		return agents_.size() - 1;
	}